

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

ObjectSlotAttributes * __thiscall
Js::PathTypeHandlerBase::UpdateAttributes
          (PathTypeHandlerBase *this,Recycler *recycler,ObjectSlotAttributes *oldAttributes,
          uint8 oldPathSize,uint8 newTypePathSize)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this_00;
  undefined4 *puVar4;
  ObjectSlotAttributes *__dest;
  undefined7 in_register_00000009;
  undefined3 in_register_00000081;
  uint uVar5;
  uint uVar6;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  uVar5 = CONCAT31(in_register_00000081,newTypePathSize);
  uVar6 = (uint)CONCAT71(in_register_00000009,oldPathSize);
  local_60 = (undefined1  [8])&ObjectSlotAttributes::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_9d33d42;
  data.filename._0_4_ = 0x8ea;
  data.plusSize = (ulong)uVar5;
  this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_60);
  if (uVar5 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    __dest = &DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      data._36_4_ = uVar6;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00dd26f6;
      *puVar4 = 0;
      uVar6 = data._36_4_;
    }
    __dest = (ObjectSlotAttributes *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (this_00,(ulong)uVar5);
    if (__dest == (ObjectSlotAttributes *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00dd26f6:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  if (oldAttributes == (ObjectSlotAttributes *)0x0) {
    uVar5 = 0;
  }
  else {
    if (newTypePathSize < (byte)uVar6) {
      uVar6 = (uint)newTypePathSize;
    }
    uVar5 = uVar6 & 0xff;
    memcpy(__dest,oldAttributes,(ulong)(uVar6 & 0xff));
  }
  if ((byte)uVar5 < newTypePathSize) {
    memset(__dest + uVar5,7,(ulong)(byte)(~(byte)uVar5 + newTypePathSize) + 1);
  }
  return __dest;
}

Assistant:

ObjectSlotAttributes * PathTypeHandlerBase::UpdateAttributes(Recycler * recycler, ObjectSlotAttributes * oldAttributes, uint8 oldPathSize, uint8 newTypePathSize)
    {
        ObjectSlotAttributes * newAttributes = RecyclerNewArrayLeaf(recycler, ObjectSlotAttributes, newTypePathSize);
        uint8 initStart;
        if (oldAttributes == nullptr)
        {
            initStart = 0;
        }
        else
        {
            // In branching cases, the new type path may be shorter than the old.
            initStart = min(newTypePathSize, oldPathSize);
            memcpy(newAttributes, oldAttributes, sizeof(ObjectSlotAttributes) * initStart);
        }
        for (uint8 i = initStart; i < newTypePathSize; i++)
        {
            newAttributes[i] = ObjectSlotAttr_Default;
        }

        return newAttributes;
    }